

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O1

void __thiscall PDA::Transducer::StoreFst::expandCurrentNTerminal(StoreFst *this)

{
  pointer *ppwVar1;
  int iVar2;
  pointer pRVar3;
  long lVar4;
  long lVar5;
  iterator __position;
  int iVar6;
  long lVar7;
  wchar_t *__args;
  wstring currentChain;
  wchar_t *local_40;
  long local_38;
  long local_30 [2];
  
  ppwVar1 = &(this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  lVar7 = (long)(this->m_currentState).m_chainIndex + 1;
  iVar6 = (int)lVar7;
  (this->m_currentState).m_chainIndex = iVar6;
  iVar2 = (this->m_currentState).m_ruleIndex;
  pRVar3 = (this->m_grammar).m_rules.
           super__Vector_base<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (iVar6 < (int)((ulong)((long)*(pointer *)
                                   ((long)&pRVar3[iVar2].m_chains.
                                           super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                                   + 8) -
                           *(long *)&pRVar3[iVar2].m_chains.
                                     super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                           ) >> 5)) {
    lVar4 = *(long *)&pRVar3[iVar2].m_chains.
                      super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                      ._M_impl;
    lVar7 = lVar7 * 0x20;
    lVar5 = *(long *)(lVar4 + lVar7);
    local_40 = (wchar_t *)local_30;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_40,lVar5,lVar5 + *(long *)(lVar4 + 8 + lVar7) * 4);
    if (local_38 != 0) {
      __args = local_40 + local_38;
      do {
        __args = __args + -1;
        __position._M_current =
             (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    ((vector<wchar_t,std::allocator<wchar_t>> *)&(this->m_currentState).m_stack,
                     __position,__args);
        }
        else {
          *__position._M_current = *__args;
          (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      } while (__args != local_40);
    }
    (this->m_currentState).m_ruleIndex = -1;
    if (local_40 != (wchar_t *)local_30) {
      operator_delete(local_40,local_30[0] * 4 + 4);
    }
    return;
  }
  rollback(this);
  return;
}

Assistant:

void expandCurrentNTerminal()
    {
        m_currentState.m_stack.pop_back();
        ++m_currentState.m_chainIndex;
        if ( m_currentState.m_chainIndex >= static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size()))
        {
            rollback();
            return;
        }
        std::wstring currentChain = m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains[static_cast<size_t>(m_currentState.m_chainIndex)].m_chain;
        for(auto it = currentChain.crbegin(); it != currentChain.crend(); ++it)
            m_currentState.m_stack.push_back(*it);
        m_currentState.m_ruleIndex = -1;
    }